

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QtPrivate::QCalendarModel::setMaximumDate(QCalendarModel *this,QDate d)

{
  long in_FS_OFFSET;
  QArrayData *pQStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined1 *puStack_68;
  undefined1 *puStack_60;
  undefined1 *puStack_58;
  undefined1 *puStack_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_38;
  long lStack_30;
  
  if ((0x16d3e147973 < d.jd + 0xb69eeff91fU) || ((this->m_maximumDate).jd == d.jd)) {
    return;
  }
  (this->m_maximumDate).jd = d.jd;
  if (d.jd < (this->m_minimumDate).jd) {
    (this->m_minimumDate).jd = d.jd;
  }
  if (d.jd < (this->m_date).jd) {
    (this->m_date).jd = d.jd;
    internalUpdate(this);
    return;
  }
  lStack_30 = *(long *)(in_FS_OFFSET + 0x28);
  tStack_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_68 = (undefined1 *)0xffffffffffffffff;
  puStack_60 = (undefined1 *)0x0;
  puStack_58 = (undefined1 *)0x0;
  (**(code **)(*(long *)this + 0x60))((QModelIndex *)&puStack_48,this,0,0,&puStack_68);
  puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_88 = (QArrayData *)0xffffffffffffffff;
  uStack_80 = 0;
  uStack_78 = 0;
  (**(code **)(*(long *)this + 0x60))
            (&puStack_68,this,this->m_firstRow + 5,this->m_firstColumn + 6,&pQStack_88);
  pQStack_88 = (QArrayData *)0x0;
  uStack_80 = 0;
  uStack_78 = 0;
  QAbstractItemModel::dataChanged
            ((QModelIndex *)this,(QModelIndex *)&puStack_48,(QList_conflict *)&puStack_68);
  if (pQStack_88 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_88,4,0x10);
    }
  }
  QAbstractItemModel::headerDataChanged((Orientation)this,2,0);
  QAbstractItemModel::headerDataChanged((Orientation)this,1,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarModel::setMaximumDate(QDate d)
{
    if (!d.isValid() || d == m_maximumDate)
        return;

    m_maximumDate = d;
    if (m_minimumDate > m_maximumDate)
        m_minimumDate = m_maximumDate;
    if (m_date > m_maximumDate)
        m_date = m_maximumDate;
    internalUpdate();
}